

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ResponseOrProtocolError * __thiscall
kj::HttpHeaders::tryParseResponse
          (ResponseOrProtocolError *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<char> content)

{
  bool bVar1;
  char *end;
  ArrayPtr<char> content_00;
  StringPtr SVar2;
  char *ptr;
  Maybe<unsigned_int> result;
  NullableValue<kj::StringPtr> _version1007;
  kj *local_80 [2];
  size_t local_70;
  char *local_68;
  Maybe<kj::StringPtr> local_60;
  kj *local_48;
  StringPtr local_40;
  
  content_00.size_ = (kj *)content.ptr;
  content_00.ptr = (char *)content.size_;
  end = trimHeaderEnding(content_00.size_,content_00);
  if (end == (char *)0x0) {
    __return_storage_ptr__->tag = 2;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Response headers have no terminal newline.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2b;
  }
  else {
    local_80[0] = content_00.size_;
    consumeWord(&local_60,(char **)local_80);
    local_48 = (kj *)CONCAT71(local_48._1_7_,local_60.ptr.isSet);
    if ((kj)local_60.ptr.isSet == (kj)0x1) {
      local_40.content.ptr = local_60.ptr.field_1.value.content.ptr;
      local_40.content.size_ = local_60.ptr.field_1.value.content.size_;
      local_60.ptr._0_8_ = "HTTP/";
      local_60.ptr.field_1.value.content.ptr = (char *)0x6;
      bVar1 = StringPtr::startsWith(&local_40,(StringPtr *)&local_60);
      if (bVar1) {
        local_48 = local_80[0];
        consumeNumber((kj *)&local_60,(char **)&local_48);
        local_80[0] = local_48;
        if ((kj)local_60.ptr.isSet == (kj)0x1) {
          local_80[1]._4_4_ = local_60.ptr._4_4_;
          SVar2 = consumeLine((char **)local_80);
          local_70 = SVar2.content.size_;
          local_68 = SVar2.content.ptr;
          bVar1 = parseHeaders(this,(char *)local_80[0],end);
          if (bVar1) {
            __return_storage_ptr__->tag = 1;
            *(undefined4 *)&__return_storage_ptr__->field_1 = local_80[1]._4_4_;
            *(char **)((long)&__return_storage_ptr__->field_1 + 8) = local_68;
            *(size_t *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_70;
            return __return_storage_ptr__;
          }
          __return_storage_ptr__->tag = 2;
          *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
          *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
          *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
               "The headers sent by the server are not valid.";
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2e;
        }
        else {
          __return_storage_ptr__->tag = 2;
          *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
          *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
          *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
               "Invalid response status line (invalid status code).";
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x34;
        }
      }
      else {
        __return_storage_ptr__->tag = 2;
        *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
        *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
             "Invalid response status line (invalid protocol).";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x31;
      }
    }
    else {
      __return_storage_ptr__->tag = 2;
      *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
      *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
      *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
           "Invalid response status line (no spaces).";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2a;
    }
  }
  *(kj **)((long)&__return_storage_ptr__->field_1 + 0x28) = content_00.size_;
  *(char **)((long)&__return_storage_ptr__->field_1 + 0x30) = (char *)content.size_;
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::ResponseOrProtocolError HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 502, "Bad Gateway",
        "Response headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_SOME(version, consumeWord(ptr)) {
    if (!version.startsWith("HTTP/")) {
      return ProtocolError { 502, "Bad Gateway",
          "Invalid response status line (invalid protocol).", content };
    }
  } else {
    return ProtocolError { 502, "Bad Gateway",
        "Invalid response status line (no spaces).", content };
  }